

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  size_type *psVar1;
  ushort uVar2;
  uint uVar3;
  PointerT<char> pcVar4;
  ushort *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  long lVar6;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined8 *puVar10;
  DescriptorNames DVar11;
  pointer prVar12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_00;
  FieldDescriptor *pFVar14;
  EnumDescriptor *pEVar15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ExtensionRange *pEVar16;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar17;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar18;
  Descriptor *pDVar19;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar20;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  string *psVar21;
  anon_union_8_1_a8a14541_for_iterator_2 aVar22;
  DescriptorPool *pDVar23;
  Rep *pRVar24;
  Symbol SVar25;
  undefined8 extraout_RAX;
  undefined4 index;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  RepeatedPtrFieldBase *pRVar29;
  InternalMetadata IVar30;
  int iVar31;
  RepeatedPtrFieldBase *pRVar32;
  ulong uVar33;
  long lVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  long lVar35;
  long lVar36;
  ulong uVar37;
  iterator iVar38;
  string_view option_name;
  string_view name;
  string_view scope;
  string_view name_00;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view proto_name;
  string_view full_name_00;
  FieldDescriptor *field;
  ExtensionRange *range;
  iterator it;
  Symbol local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  RepeatedPtrFieldBase *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [80];
  code *pcStack_98;
  undefined8 local_90;
  code *pcStack_88;
  undefined8 local_80;
  code *pcStack_78;
  pointer local_70;
  code *pcStack_68;
  pointer local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (parent == (Descriptor *)0x0) {
    psVar21 = this->file_->package_;
    pcVar28 = (psVar21->_M_dataplus)._M_p;
    uVar33 = psVar21->_M_string_length;
  }
  else {
    pcVar28 = (parent->all_names_).payload_;
    uVar33 = (ulong)*(ushort *)(pcVar28 + 2);
    pcVar28 = pcVar28 + ~uVar33;
  }
  puVar10 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = pcVar28;
  scope._M_len = uVar33;
  proto_name._M_str = (char *)*puVar10;
  proto_name._M_len = puVar10[1];
  local_138.ptr_ = &result->super_SymbolBase;
  DVar11 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar11.payload_;
  puVar10 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar11.payload_ + 2);
  full_name_00._M_str = (FlatAllocator *)(DVar11.payload_ + ~full_name_00._M_len);
  name_00._M_str = (char *)*puVar10;
  name_00._M_len = puVar10[1];
  ValidateSymbolName(this,name_00,full_name_00,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  uVar2 = *(ushort *)&result->field_0x1;
  *(ushort *)&result->field_0x1 = uVar2 & 0xff80;
  result->options_ = (MessageOptions *)0x0;
  *(ushort *)&result->field_0x1 =
       uVar2 & 0xfc80 | (ushort)(((proto->field_0)._impl_.visibility_ & 3U) << 8);
  pcVar28 = (result->all_names_).payload_;
  local_e8._0_8_ = ZEXT28(*(ushort *)(pcVar28 + 2));
  local_e8._8_8_ = pcVar28 + ~local_e8._0_8_;
  local_130._M_string_length = (size_type)parent;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                           *)&((this->pool_->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl)->well_known_types_,
                          (key_arg<std::basic_string_view<char>_> *)local_e8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)&((this->pool_->tables_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl)->well_known_types_);
  local_e8._0_8_ = (DescriptorPool *)0x0;
  bVar9 = absl::lts_20250127::container_internal::operator==
                    ((iterator *)&local_40,(iterator *)local_e8);
  if (!bVar9) {
    prVar12 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              ::iterator::operator->((iterator *)&local_40);
    *(ushort *)(local_138.ptr_ + 1) =
         (*(ushort *)(local_138.ptr_ + 1) & 0xff83) + ((ushort)prVar12->second & 0x1f) * 4;
  }
  *(uint16_t *)(local_138.ptr_ + 4) = 0;
  this_00 = &(proto->field_0)._impl_.field_;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    uVar27 = 0;
    do {
      pVVar13 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&this_00->super_RepeatedPtrFieldBase,uVar27);
      uVar3 = (pVVar13->field_0)._impl_.number_;
      if ((uVar3 != uVar27 + 1) ||
         (*(uint16_t *)(local_138.ptr_ + 4) = (uint16_t)uVar3, 0xfffd < uVar27)) break;
      uVar27 = uVar3;
    } while ((int)uVar3 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar31 = *(int *)((long)&proto->field_0 + 0x88);
  *(int *)(local_138.ptr_ + 0x80) = iVar31;
  pcVar4 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar4 == (PointerT<char>)0x0) {
    BuildMessage((DescriptorBuilder *)local_e8);
LAB_00166bb7:
    BuildMessage();
  }
  else {
    iVar26 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<char>.value;
    iVar31 = iVar31 * 0x38 + iVar26;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar31;
    if ((alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).total_.payload_.super_Base<char>.value < iVar31) goto LAB_00166bb7;
    *(OneofDescriptor **)(local_138.ptr_ + 0x48) = (OneofDescriptor *)(pcVar4 + iVar26);
    local_e8._32_8_ = this_00;
    if (0 < *(int *)((long)&proto->field_0 + 0x88)) {
      lVar35 = 0;
      lVar36 = 0;
      do {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                             (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                              (int)lVar36);
        full_name_00._M_str = alloc;
        BuildOneof(this,proto_00,(Descriptor *)local_138.ptr_,
                   (OneofDescriptor *)
                   (&(*(OneofDescriptor **)(local_138.ptr_ + 0x48))->super_SymbolBase + lVar35),
                   alloc);
        lVar36 = lVar36 + 1;
        lVar35 = lVar35 + 0x38;
      } while (lVar36 < *(int *)((long)&proto->field_0 + 0x88));
    }
    uVar7 = local_e8._32_8_;
    iVar31 = *(int *)((long)&proto->field_0 + 0x10);
    *(int *)(local_138.ptr_ + 8) = iVar31;
    pFVar14 = anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::FieldDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar31);
    *(FieldDescriptor **)(local_138.ptr_ + 0x40) = pFVar14;
    if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
      lVar36 = 0;
      lVar35 = 0;
      do {
        pVVar13 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            ((RepeatedPtrFieldBase *)uVar7,(int)lVar35);
        full_name_00._M_str = (FlatAllocator *)0x0;
        BuildFieldOrExtension
                  (this,pVVar13,(Descriptor *)local_138.ptr_,
                   (FieldDescriptor *)
                   (&(*(FieldDescriptor **)(local_138.ptr_ + 0x40))->super_SymbolBase + lVar36),
                   false,alloc);
        lVar35 = lVar35 + 1;
        lVar36 = lVar36 + 0x58;
      } while (lVar35 < *(int *)((long)&proto->field_0 + 0x10));
    }
    iVar31 = *(int *)((long)&proto->field_0 + 0x40);
    *(int *)(local_138.ptr_ + 0x8c) = iVar31;
    pEVar15 = anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::EnumDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar31);
    *(EnumDescriptor **)(local_138.ptr_ + 0x58) = pEVar15;
    if (0 < *(int *)((long)&proto->field_0 + 0x40)) {
      lVar35 = 0;
      lVar36 = 0;
      do {
        proto_01 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                             (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                              (int)lVar36);
        full_name_00._M_str = alloc;
        BuildEnum(this,proto_01,(Descriptor *)local_138.ptr_,
                  (EnumDescriptor *)
                  (&(*(EnumDescriptor **)(local_138.ptr_ + 0x58))->super_SymbolBase + lVar35),alloc)
        ;
        lVar36 = lVar36 + 1;
        lVar35 = lVar35 + 0x58;
      } while (lVar36 < *(int *)((long)&proto->field_0 + 0x40));
    }
    iVar31 = *(int *)((long)&proto->field_0 + 0x58);
    *(int *)(local_138.ptr_ + 0x90) = iVar31;
    pEVar16 = anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar31);
    *(ExtensionRange **)(local_138.ptr_ + 0x60) = pEVar16;
    if (0 < *(int *)((long)&proto->field_0 + 0x58)) {
      lVar35 = 0;
      lVar36 = 0;
      do {
        pVVar17 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                            (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                             (int)lVar36);
        full_name_00._M_str = alloc;
        BuildExtensionRange(this,pVVar17,(Descriptor *)local_138.ptr_,
                            (ExtensionRange *)
                            ((long)&(*(ExtensionRange **)(local_138.ptr_ + 0x60))->start_ + lVar35),
                            alloc);
        lVar36 = lVar36 + 1;
        lVar35 = lVar35 + 0x28;
      } while (lVar36 < *(int *)((long)&proto->field_0 + 0x58));
    }
    iVar31 = *(int *)((long)&proto->field_0 + 0x70);
    *(int *)(local_138.ptr_ + 0x94) = iVar31;
    pFVar14 = anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::FieldDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar31);
    *(FieldDescriptor **)(local_138.ptr_ + 0x68) = pFVar14;
    if (0 < *(int *)((long)&proto->field_0 + 0x70)) {
      lVar35 = 0;
      lVar36 = 0;
      do {
        pVVar13 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                             (int)lVar36);
        full_name_00._M_str = (FlatAllocator *)0x1;
        BuildFieldOrExtension
                  (this,pVVar13,(Descriptor *)local_138.ptr_,
                   (FieldDescriptor *)
                   (&(*(FieldDescriptor **)(local_138.ptr_ + 0x68))->super_SymbolBase + lVar35),true
                   ,alloc);
        lVar36 = lVar36 + 1;
        lVar35 = lVar35 + 0x58;
      } while (lVar36 < *(int *)((long)&proto->field_0 + 0x70));
    }
    iVar31 = *(int *)((long)&proto->field_0 + 0xa0);
    *(int *)(local_138.ptr_ + 0x98) = iVar31;
    pcVar4 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<char>.value;
    if (pcVar4 != (PointerT<char>)0x0) {
      iVar26 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar31 = iVar26 + iVar31 * 8;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar31;
      if (iVar31 <= (alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).total_.payload_.super_Base<char>.value) {
        *(ReservedRange **)(local_138.ptr_ + 0x70) = (ReservedRange *)(pcVar4 + iVar26);
        if (0 < *(int *)((long)&proto->field_0 + 0xa0)) {
          lVar35 = 0;
          lVar36 = 0;
          do {
            pVVar18 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase
                                 ,(int)lVar36);
            BuildReservedRange(this,pVVar18,(Descriptor *)local_138.ptr_,
                               (ReservedRange *)
                               ((long)&(*(ReservedRange **)(local_138.ptr_ + 0x70))->start + lVar35)
                               ,full_name_00._M_str);
            lVar36 = lVar36 + 1;
            lVar35 = lVar35 + 8;
          } while (lVar36 < *(int *)((long)&proto->field_0 + 0xa0));
        }
        option_name._M_str = "google.protobuf.MessageOptions";
        option_name._M_len = 0x1e;
        AllocateOptions<google::protobuf::Descriptor>
                  (this,proto,(Descriptor *)local_138.ptr_,7,option_name,alloc);
        iVar31 = this->recursion_depth_;
        this->recursion_depth_ = iVar31 + -1;
        if (iVar31 < 2) {
          element_name._M_len =
               (ulong)*(ushort *)(((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ + 2);
          element_name._M_str =
               ((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ + ~element_name._M_len;
          AddError(this,element_name,&proto->super_Message,OTHER,
                   "Reached maximum recursion limit for nested messages.");
          *(Descriptor **)(local_138.ptr_ + 0x50) = (Descriptor *)0x0;
          *(int *)(local_138.ptr_ + 0x88) = 0;
        }
        else {
          iVar31 = *(int *)((long)&proto->field_0 + 0x28);
          *(int *)(local_138.ptr_ + 0x88) = iVar31;
          pDVar19 = anon_unknown_24::
                    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ::AllocateArray<google::protobuf::Descriptor>
                              (&alloc->
                                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               ,iVar31);
          *(Descriptor **)(local_138.ptr_ + 0x50) = pDVar19;
          if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
            lVar35 = 0;
            lVar36 = 0;
            do {
              proto_02 = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                   (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase
                                    ,(int)lVar36);
              BuildMessage(this,proto_02,(Descriptor *)local_138.ptr_,
                           (Descriptor *)
                           (&(*(Descriptor **)(local_138.ptr_ + 0x50))->super_SymbolBase + lVar35),
                           alloc);
              lVar36 = lVar36 + 1;
              lVar35 = lVar35 + 0xa0;
            } while (lVar36 < *(int *)((long)&proto->field_0 + 0x28));
          }
          uVar27 = *(uint *)((long)&proto->field_0 + 0xb8);
          *(uint *)(local_138.ptr_ + 0x9c) = uVar27;
          ppbVar20 = (anonymous_namespace)::
                     FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                     ::AllocateArray<std::__cxx11::string_const*>
                               ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                 *)alloc,uVar27);
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
           (local_138.ptr_ + 0x78) = ppbVar20;
          local_130.field_2._M_allocated_capacity = (size_type)proto;
          if (0 < (int)uVar27) {
            uVar33 = 0;
            do {
              in = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,
                              (int)uVar33);
              psVar21 = (anonymous_namespace)::
                        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        ::AllocateStrings<std::__cxx11::string_const&>
                                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                    *)alloc,in);
              (*(string ***)(local_138.ptr_ + 0x78))[uVar33] = psVar21;
              uVar33 = uVar33 + 1;
            } while (uVar27 != uVar33);
          }
          uVar7 = local_130.field_2._M_allocated_capacity;
          puVar5 = *(ushort **)(local_138.ptr_ + 0x10);
          full_name._M_len = (ulong)puVar5[1];
          full_name._M_str = (char *)(~full_name._M_len + (long)puVar5);
          name._M_len = (ulong)*puVar5;
          name._M_str = (char *)(~name._M_len + (long)puVar5);
          (local_138.ptr_)->symbol_type_ = '\x01';
          AddSymbol(this,full_name,(void *)local_130._M_string_length,name,
                    (Message *)local_130.field_2._M_allocated_capacity,local_138);
          local_130._M_string_length = (size_type)this;
          if (0 < *(int *)(uVar7 + 0xb0)) {
            pRVar32 = (RepeatedPtrFieldBase *)(local_130.field_2._M_allocated_capacity + 0xa8);
            index = 0;
            do {
              aVar22.slot_ = (slot_type *)
                             internal::RepeatedPtrFieldBase::
                             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                       (pRVar32,index);
              iVar26 = index + 1;
              iVar31 = *(int *)(local_130.field_2._M_allocated_capacity + 0xb0);
              local_130.field_2._8_4_ = iVar26;
              local_110 = (RepeatedPtrFieldBase *)(ulong)(uint)index;
              if (iVar26 < iVar31) {
                do {
                  pDVar23 = (DescriptorPool *)
                            internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                      (pRVar32,iVar26);
                  if ((*(int *)&pDVar23->fallback_database_ < *(int *)((long)aVar22.slot_ + 0x1c))
                     && (*(int *)((long)aVar22.slot_ + 0x18) <
                         *(int *)((long)&pDVar23->fallback_database_ + 4))) {
                    lVar35 = *(long *)(local_138.ptr_ + 0x10);
                    uVar33 = (ulong)*(ushort *)(lVar35 + 2);
                    pVVar18 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                        (pRVar32,(int)local_110);
                    pcStack_48 = absl::lts_20250127::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                    ;
                    local_50.obj = local_e8;
                    make_error.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                    ;
                    make_error.ptr_.obj = local_50.obj;
                    element_name_00._M_str = (char *)(lVar35 + ~uVar33);
                    element_name_00._M_len = uVar33;
                    local_e8._0_8_ = pDVar23;
                    local_e8._8_8_ = aVar22.slot_;
                    AddError((DescriptorBuilder *)local_130._M_string_length,element_name_00,
                             &pVVar18->super_Message,NUMBER,make_error);
                  }
                  iVar26 = iVar26 + 1;
                  iVar31 = *(int *)(local_130.field_2._M_allocated_capacity + 0xb0);
                } while (iVar26 < iVar31);
              }
              index = local_130.field_2._8_4_;
            } while ((int)local_130.field_2._8_4_ < iVar31);
          }
          uVar7 = local_130.field_2._M_allocated_capacity;
          local_e8._0_8_ = (DescriptorPool *)0x1;
          local_e8._8_8_ = (slot_type *)0x0;
          pRVar32 = (RepeatedPtrFieldBase *)(local_130.field_2._M_allocated_capacity + 0xc0);
          pRVar29 = pRVar32;
          if ((*(byte *)(local_130.field_2._M_allocated_capacity + 0xc0) & 1) != 0) {
            pRVar24 = internal::RepeatedPtrFieldBase::rep(pRVar32);
            pRVar29 = (RepeatedPtrFieldBase *)pRVar24->elements;
            if (((ulong)pRVar32->tagged_rep_or_elem_ & 1) != 0) {
              pRVar24 = internal::RepeatedPtrFieldBase::rep(pRVar32);
              pRVar32 = (RepeatedPtrFieldBase *)pRVar24->elements;
            }
          }
          iVar31 = *(int *)(uVar7 + 200);
          if (pRVar29 != (RepeatedPtrFieldBase *)(&pRVar32->tagged_rep_or_elem_ + iVar31)) {
            psVar1 = &local_108._M_string_length;
            do {
              key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pRVar29->tagged_rep_or_elem_;
              local_130._M_dataplus._M_p = local_e8;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::EmplaceDecomposable::operator()
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                          *)psVar1,&local_130,key_00,key_00);
              if (local_108.field_2._M_local_buf[8] == '\0') {
                pcStack_58 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
                ;
                make_error_00.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
                ;
                make_error_00.ptr_.obj = psVar1;
                element_name_01._M_str = (key_00->_M_dataplus)._M_p;
                element_name_01._M_len = key_00->_M_string_length;
                local_108._M_string_length = (size_type)key_00;
                local_60 = (pointer)psVar1;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_01,
                         (Message *)local_130.field_2._M_allocated_capacity,NAME,make_error_00);
              }
              pRVar29 = (RepeatedPtrFieldBase *)&pRVar29->current_size_;
            } while (pRVar29 != (RepeatedPtrFieldBase *)(&pRVar32->tagged_rep_or_elem_ + iVar31));
          }
          if (0 < *(int *)(local_138.ptr_ + 8)) {
            local_130.field_2._8_8_ = local_130._M_string_length + 0xe8;
            local_110 = (RepeatedPtrFieldBase *)(local_130.field_2._M_allocated_capacity + 0x60);
            local_e8._48_8_ = local_130.field_2._M_allocated_capacity + 0xa8;
            IVar30.ptr_ = 0;
            psVar1 = &local_108._M_string_length;
            do {
              local_130._M_dataplus._M_p =
                   (pointer)(*(long *)(local_138.ptr_ + 0x40) + IVar30.ptr_ * 0x58);
              SVar25.ptr_ = local_138.ptr_;
              local_e8._40_8_ = IVar30.ptr_;
              if (0 < *(int *)(local_138.ptr_ + 0x90)) {
                lVar35 = 0;
                lVar36 = 0;
                do {
                  lVar34 = *(long *)(SVar25.ptr_ + 0x60);
                  local_108._M_dataplus._M_p = (pointer)(lVar34 + lVar35);
                  if ((*(int *)(lVar34 + lVar35) <= *(int *)(local_130._M_dataplus._M_p + 4)) &&
                     (*(int *)(local_130._M_dataplus._M_p + 4) < *(int *)(lVar34 + 4 + lVar35))) {
                    absl::lts_20250127::container_internal::
                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                    ::try_emplace_impl<google::protobuf::Descriptor*const&>
                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                                *)psVar1,(void *)local_130.field_2._8_8_,(Descriptor **)&local_138);
                    uVar7 = local_108.field_2._M_allocated_capacity;
                    pVVar17 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        (local_110,(int)lVar36);
                    iVar31 = *(int *)(uVar7 + 8);
                    if (iVar31 < 0) {
                      iVar31 = -1;
                    }
                    uVar27 = iVar31 + 1;
                    if (0x1ffffffe < uVar27) {
                      uVar27 = 0x1fffffff;
                    }
                    *(uint *)(uVar7 + 8) = uVar27;
                    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(uVar7 + 0x10))->_M_allocated_capacity == 0) {
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(uVar7 + 0x10))->_M_allocated_capacity = (size_type)pVVar17;
                      *(undefined4 *)(uVar7 + 0x18) = 1;
                    }
                    lVar34 = *(long *)(local_130._M_dataplus._M_p + 8);
                    uVar33 = (ulong)*(ushort *)(lVar34 + 2);
                    pVVar17 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        (local_110,(int)lVar36);
                    local_108._M_string_length = (size_type)&local_108;
                    local_108.field_2._M_allocated_capacity = (size_type)&local_130;
                    pcStack_68 = absl::lts_20250127::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                    ;
                    make_error_01.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                    ;
                    make_error_01.ptr_.obj = psVar1;
                    element_name_02._M_str = (char *)(lVar34 + ~uVar33);
                    element_name_02._M_len = uVar33;
                    local_70 = (pointer)psVar1;
                    AddError((DescriptorBuilder *)local_130._M_string_length,element_name_02,
                             &pVVar17->super_Message,NUMBER,make_error_01);
                    SVar25.ptr_ = local_138.ptr_;
                  }
                  lVar36 = lVar36 + 1;
                  lVar35 = lVar35 + 0x28;
                } while (lVar36 < *(int *)(SVar25.ptr_ + 0x90));
              }
              uVar7 = local_e8._48_8_;
              if (0 < *(int *)(SVar25.ptr_ + 0x98)) {
                lVar35 = 0;
                do {
                  if ((*(int *)(*(long *)(SVar25.ptr_ + 0x70) + lVar35 * 8) <=
                       *(int *)(local_130._M_dataplus._M_p + 4)) &&
                     (*(int *)(local_130._M_dataplus._M_p + 4) <
                      *(int *)(*(long *)(SVar25.ptr_ + 0x70) + lVar35 * 8 + 4))) {
                    absl::lts_20250127::container_internal::
                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                    ::try_emplace_impl<google::protobuf::Descriptor*const&>
                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                                *)psVar1,(void *)local_130.field_2._8_8_,(Descriptor **)&local_138);
                    uVar8 = local_108.field_2._M_allocated_capacity;
                    pVVar18 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                        ((RepeatedPtrFieldBase *)uVar7,(int)lVar35);
                    iVar31 = *(int *)(uVar8 + 8);
                    if (iVar31 < 0) {
                      iVar31 = -1;
                    }
                    uVar27 = iVar31 + 1;
                    if (0x1ffffffe < uVar27) {
                      uVar27 = 0x1fffffff;
                    }
                    *(uint *)(uVar8 + 8) = uVar27;
                    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(uVar8 + 0x10))->_M_allocated_capacity == 0) {
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(uVar8 + 0x10))->_M_allocated_capacity = (size_type)pVVar18;
                      *(undefined4 *)(uVar8 + 0x18) = 1;
                    }
                    lVar36 = *(long *)(local_130._M_dataplus._M_p + 8);
                    uVar33 = (ulong)*(ushort *)(lVar36 + 2);
                    pVVar18 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                        ((RepeatedPtrFieldBase *)uVar7,(int)lVar35);
                    local_108._M_string_length = (size_type)&local_130;
                    pcStack_78 = absl::lts_20250127::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                    ;
                    make_error_02.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                    ;
                    make_error_02.ptr_.obj = psVar1;
                    element_name_03._M_str = (char *)(lVar36 + ~uVar33);
                    element_name_03._M_len = uVar33;
                    local_80 = psVar1;
                    AddError((DescriptorBuilder *)local_130._M_string_length,element_name_03,
                             &pVVar18->super_Message,NUMBER,make_error_02);
                    SVar25.ptr_ = local_138.ptr_;
                  }
                  lVar35 = lVar35 + 1;
                } while (lVar35 < *(int *)(SVar25.ptr_ + 0x98));
              }
              local_108._M_string_length = (size_type)**(ushort **)(local_130._M_dataplus._M_p + 8);
              local_108.field_2._M_allocated_capacity =
                   (long)*(ushort **)(local_130._M_dataplus._M_p + 8) + ~local_108._M_string_length;
              iVar38 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                       ::find<std::basic_string_view<char,std::char_traits<char>>>
                                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                                   *)local_e8,(key_arg<std::basic_string_view<char>_> *)psVar1);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)local_e8);
              if (iVar38.ctrl_ != (ctrl_t *)0x0) {
                lVar35 = *(long *)(local_130._M_dataplus._M_p + 8);
                uVar33 = (ulong)*(ushort *)(lVar35 + 2);
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                    ((RepeatedPtrFieldBase *)local_e8._32_8_,(int)local_e8._40_8_);
                local_108._M_string_length = (size_type)&local_130;
                pcStack_88 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
                ;
                make_error_03.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
                ;
                make_error_03.ptr_.obj = psVar1;
                element_name_04._M_str = (char *)(lVar35 + ~uVar33);
                element_name_04._M_len = uVar33;
                local_90 = psVar1;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_04,
                         &pVVar13->super_Message,NAME,make_error_03);
              }
              IVar30.ptr_ = local_e8._40_8_ + 1;
            } while (IVar30.ptr_ < *(int *)(local_138.ptr_ + 8));
          }
          if (0 < *(int *)(local_138.ptr_ + 0x90)) {
            local_130.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity + 0x60
            ;
            pRVar32 = (RepeatedPtrFieldBase *)0x28;
            local_130.field_2._8_4_ = 1;
            lVar35 = 0;
            SVar25.ptr_ = local_138.ptr_;
            do {
              local_130._M_dataplus._M_p = (pointer)(*(long *)(SVar25.ptr_ + 0x60) + lVar35 * 0x28);
              iVar31 = (int)lVar35;
              if (0 < *(int *)(SVar25.ptr_ + 0x98)) {
                lVar34 = 0;
                lVar36 = 0;
                do {
                  lVar6 = *(long *)(SVar25.ptr_ + 0x70);
                  local_108._M_dataplus._M_p = (pointer)(lVar6 + lVar34);
                  if ((*(int *)(lVar6 + lVar34) < *(int *)(local_130._M_dataplus._M_p + 4)) &&
                     (*(int *)local_130._M_dataplus._M_p < *(int *)(lVar6 + 4 + lVar34))) {
                    lVar6 = *(long *)(SVar25.ptr_ + 0x10);
                    uVar33 = (ulong)*(ushort *)(lVar6 + 2);
                    pVVar17 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        ((RepeatedPtrFieldBase *)
                                         local_130.field_2._M_allocated_capacity,iVar31);
                    local_108._M_string_length = (size_type)&local_130;
                    local_108.field_2._M_allocated_capacity = (size_type)&local_108;
                    pcStack_98 = absl::lts_20250127::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                    ;
                    local_e8._72_8_ = &local_108._M_string_length;
                    make_error_04.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                    ;
                    make_error_04.ptr_.obj = (void *)local_e8._72_8_;
                    element_name_05._M_str = (char *)(lVar6 + ~uVar33);
                    element_name_05._M_len = uVar33;
                    AddError((DescriptorBuilder *)local_130._M_string_length,element_name_05,
                             &pVVar17->super_Message,NUMBER,make_error_04);
                    SVar25.ptr_ = local_138.ptr_;
                  }
                  lVar36 = lVar36 + 1;
                  lVar34 = lVar34 + 8;
                } while (lVar36 < *(int *)(SVar25.ptr_ + 0x98));
              }
              lVar35 = lVar35 + 1;
              local_110 = pRVar32;
              if (lVar35 < *(int *)(SVar25.ptr_ + 0x90)) {
                uVar33 = local_130.field_2._8_8_ & 0xffffffff;
                do {
                  lVar36 = *(long *)(SVar25.ptr_ + 0x60);
                  local_108._M_dataplus._M_p =
                       (pointer)((long)&pRVar32->tagged_rep_or_elem_ + lVar36);
                  if ((*(int *)((long)&pRVar32->tagged_rep_or_elem_ + lVar36) <
                       *(int *)(local_130._M_dataplus._M_p + 4)) &&
                     (*(int *)local_130._M_dataplus._M_p <
                      *(int *)((long)&pRVar32->tagged_rep_or_elem_ + lVar36 + 4))) {
                    lVar36 = *(long *)(SVar25.ptr_ + 0x10);
                    uVar37 = (ulong)*(ushort *)(lVar36 + 2);
                    pVVar17 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        ((RepeatedPtrFieldBase *)
                                         local_130.field_2._M_allocated_capacity,iVar31);
                    local_108._M_string_length = (size_type)&local_108;
                    local_108.field_2._M_allocated_capacity = (size_type)&local_130;
                    local_e8._64_8_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                    ;
                    local_e8._56_8_ = &local_108._M_string_length;
                    make_error_05.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                    ;
                    make_error_05.ptr_.obj = (void *)local_e8._56_8_;
                    element_name_06._M_str = (char *)(lVar36 + ~uVar37);
                    element_name_06._M_len = uVar37;
                    AddError((DescriptorBuilder *)local_130._M_string_length,element_name_06,
                             &pVVar17->super_Message,NUMBER,make_error_05);
                    SVar25.ptr_ = local_138.ptr_;
                  }
                  pRVar32 = (RepeatedPtrFieldBase *)&pRVar32[1].arena_;
                  uVar27 = (int)uVar33 + 1;
                  uVar33 = (ulong)uVar27;
                } while ((int)uVar27 < *(int *)(SVar25.ptr_ + 0x90));
              }
              pRVar32 = (RepeatedPtrFieldBase *)&local_110[1].arena_;
              local_130.field_2._8_4_ = local_130.field_2._8_4_ + 1;
            } while (lVar35 < *(int *)(SVar25.ptr_ + 0x90));
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)local_e8);
          this = (DescriptorBuilder *)local_130._M_string_length;
        }
        this->recursion_depth_ = this->recursion_depth_ + 1;
        return;
      }
      goto LAB_00166bcb;
    }
  }
  BuildMessage((DescriptorBuilder *)local_e8);
LAB_00166bcb:
  BuildMessage();
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_e8);
  *(int *)&((Descriptor *)(local_130._M_string_length + 0x140))->proto_features_ =
       *(int *)&((Descriptor *)(local_130._M_string_length + 0x140))->proto_features_ + 1;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}